

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O1

bool __thiscall QIODevice::seek(QIODevice *this,qint64 pos)

{
  QIODevicePrivate *this_00;
  bool bVar1;
  int iVar2;
  
  this_00 = (this->d_ptr)._M_t.
            super___uniq_ptr_impl<QIODevicePrivate,_std::default_delete<QIODevicePrivate>_>._M_t.
            super__Tuple_impl<0UL,_QIODevicePrivate_*,_std::default_delete<QIODevicePrivate>_>.
            super__Head_base<0UL,_QIODevicePrivate_*,_false>._M_head_impl;
  if (this_00->accessMode == Unset) {
    iVar2 = (*this_00->q_ptr->_vptr_QIODevice[2])();
    this_00->accessMode = RandomAccess - (char)iVar2;
  }
  if (this_00->accessMode == Sequential) {
    bVar1 = false;
  }
  else {
    bVar1 = false;
    if ((-1 < pos) &&
       (bVar1 = false,
       (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i != 0)) {
      this_00->devicePos = pos;
      QIODevicePrivate::seekBuffer(this_00,pos);
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool QIODevice::seek(qint64 pos)
{
    Q_D(QIODevice);
    if (d->isSequential()) {
        checkWarnMessage(this, "seek", "Cannot call seek on a sequential device");
        return false;
    }
    if (d->openMode == NotOpen) {
        checkWarnMessage(this, "seek", "The device is not open");
        return false;
    }
    if (pos < 0) {
        qWarning("QIODevice::seek: Invalid pos: %lld", pos);
        return false;
    }

#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::seek(%lld), before: d->pos = %lld, d->buffer.size() = %lld\n",
           this, pos, d->pos, d->buffer.size());
#endif

    d->devicePos = pos;
    d->seekBuffer(pos);

#if defined QIODEVICE_DEBUG
    printf("%p \tafter: d->pos == %lld, d->buffer.size() == %lld\n", this, d->pos,
           d->buffer.size());
#endif
    return true;
}